

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

CBString * regionTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  undefined7 in_register_00000031;
  char *s;
  
  switch(CONCAT71(in_register_00000031,type) & 0xffffffff) {
  case 0:
    s = "Descriptor";
    break;
  case 1:
    s = "BIOS";
    break;
  case 2:
    s = "ME";
    break;
  case 3:
    s = "GbE";
    break;
  case 4:
    s = "PDR";
    break;
  case 5:
    s = "DevExp1";
    break;
  case 6:
    s = "BIOS2";
    break;
  case 7:
    s = "Microcode";
    break;
  case 8:
    s = "EC";
    break;
  case 9:
    s = "DevExp2";
    break;
  case 10:
    s = "IE";
    break;
  case 0xb:
    s = "10GbE1";
    break;
  case 0xc:
    s = "10GbE2";
    break;
  case 0xd:
    s = "Reserved1";
    break;
  case 0xe:
    s = "Reserved2";
    break;
  case 0xf:
    s = "PTT";
    break;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",type);
    return __return_storage_ptr__;
  }
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

UString regionTypeToUString(const UINT8 type)
{
    switch (type) {
        case Subtypes::DescriptorRegion:  return UString("Descriptor");
        case Subtypes::BiosRegion:        return UString("BIOS");
        case Subtypes::MeRegion:          return UString("ME");
        case Subtypes::GbeRegion:         return UString("GbE");
        case Subtypes::PdrRegion:         return UString("PDR");
        case Subtypes::DevExp1Region:     return UString("DevExp1");
        case Subtypes::Bios2Region:       return UString("BIOS2");
        case Subtypes::MicrocodeRegion:   return UString("Microcode");
        case Subtypes::EcRegion:          return UString("EC");
        case Subtypes::DevExp2Region:     return UString("DevExp2");
        case Subtypes::IeRegion:          return UString("IE");
        case Subtypes::Tgbe1Region:       return UString("10GbE1");
        case Subtypes::Tgbe2Region:       return UString("10GbE2");
        case Subtypes::Reserved1Region:   return UString("Reserved1");
        case Subtypes::Reserved2Region:   return UString("Reserved2");
        case Subtypes::PttRegion:         return UString("PTT");
    };
    
    return  usprintf("Unknown %02Xh", type);
}